

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,BreakStmt *node)

{
  FunctionModule *this_00;
  BBLIter BVar1;
  __shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<mocker::ir::Label> loopSuccessor;
  __shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  BVar1 = BuilderContext::getCurBasicBlock(this->ctx);
  this_00 = this->ctx->curFunc;
  p_Var2 = &BuilderContext::getCurLoopSuccessor(this->ctx)->
            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_30,p_Var2);
  BuilderContext::emplaceInst<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
            (this->ctx,(shared_ptr<mocker::ir::Label> *)&local_30);
  BVar1 = FunctionModule::insertBBAfter(this_00,BVar1);
  BuilderContext::setCurBasicBlock(this->ctx,BVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void Builder::operator()(const ast::BreakStmt &node) const {
  auto originBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto loopSuccessor = ctx.getCurLoopSuccessor();
  ctx.emplaceInst<Jump>(loopSuccessor);

  auto successorBB = func.insertBBAfter(originBB);
  ctx.setCurBasicBlock(successorBB);
}